

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_ask.cxx
# Opt level: O0

int innards(char *fmt,__va_list_tag *ap,char *b0,char *b1,char *b2)

{
  Fl_Box *this;
  int iVar1;
  uint uVar2;
  char *a;
  char *pcVar3;
  Fl_Window *win;
  Fl_Group *g_00;
  Fl_Window *__stat_loc;
  undefined8 *local_470;
  Fl_Group *current_group;
  Fl_Window *g;
  char *prev_icon_label;
  char buffer [1024];
  char *b2_local;
  char *b1_local;
  char *b0_local;
  __va_list_tag *ap_local;
  char *fmt_local;
  
  Fl::pushed((Fl_Widget *)0x0);
  avoidRecursion = '\x01';
  makeform();
  Fl_Widget::size((Fl_Widget *)message_form,0x19a,0x67);
  iVar1 = strcmp(fmt,"%s");
  this = message;
  if (iVar1 == 0) {
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_470 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_470 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_470 + 1;
    }
    Fl_Widget::label(&this->super_Fl_Widget,(char *)*local_470);
  }
  else {
    vsnprintf((char *)&prev_icon_label,0x400,fmt,ap);
    Fl_Widget::label(&message->super_Fl_Widget,(char *)&prev_icon_label);
  }
  Fl_Widget::labelfont(&message->super_Fl_Widget,fl_message_font_);
  if (fl_message_size_ == -1) {
    Fl_Widget::labelsize(&message->super_Fl_Widget,FL_NORMAL_SIZE);
  }
  else {
    Fl_Widget::labelsize(&message->super_Fl_Widget,fl_message_size_);
  }
  if (b0 == (char *)0x0) {
    (*(button[0]->super_Fl_Widget)._vptr_Fl_Widget[6])();
    Fl_Widget::position(&button[1]->super_Fl_Widget,0x136,0x46);
  }
  else {
    (*(button[0]->super_Fl_Widget)._vptr_Fl_Widget[5])();
    Fl_Widget::label(&button[0]->super_Fl_Widget,b0);
    Fl_Widget::position(&button[1]->super_Fl_Widget,0xd2,0x46);
  }
  if (b1 == (char *)0x0) {
    (*(button[1]->super_Fl_Widget)._vptr_Fl_Widget[6])();
  }
  else {
    (*(button[1]->super_Fl_Widget)._vptr_Fl_Widget[5])();
    Fl_Widget::label(&button[1]->super_Fl_Widget,b1);
  }
  if (b2 == (char *)0x0) {
    (*(button[2]->super_Fl_Widget)._vptr_Fl_Widget[6])();
  }
  else {
    (*(button[2]->super_Fl_Widget)._vptr_Fl_Widget[5])();
    Fl_Widget::label(&button[2]->super_Fl_Widget,b2);
  }
  a = Fl_Widget::label(&icon->super_Fl_Widget);
  if (a == (char *)0x0) {
    Fl_Widget::label(&icon->super_Fl_Widget,iconlabel);
  }
  resizeform();
  uVar2 = Fl_Widget::visible(&button[1]->super_Fl_Widget);
  if (uVar2 != 0) {
    uVar2 = Fl_Widget::visible((Fl_Widget *)input);
    if (uVar2 == 0) {
      Fl_Widget::take_focus(&button[1]->super_Fl_Widget);
    }
  }
  if (enableHotspot != 0) {
    Fl_Window::hotspot(message_form,&button[0]->super_Fl_Widget,0);
  }
  if (b0 != (char *)0x0) {
    uVar2 = Fl_Widget::label_shortcut(b0);
    if (uVar2 != 0) {
      Fl_Button::shortcut(button[0],0);
      goto LAB_00243328;
    }
  }
  Fl_Button::shortcut(button[0],0xff1b);
LAB_00243328:
  pcVar3 = Fl_Window::label(message_form);
  if ((pcVar3 == (char *)0x0) && (message_title_default != (char *)0x0)) {
    Fl_Window::label(message_form,message_title_default);
  }
  win = Fl::grab();
  if (win != (Fl_Window *)0x0) {
    Fl::grab((Fl_Window *)0x0);
  }
  g_00 = Fl_Group::current();
  (*(message_form->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl_Group::current(g_00);
  while( true ) {
    __stat_loc = message_form;
    iVar1 = Fl_Window::shown(message_form);
    if (iVar1 == 0) break;
    Fl::wait(__stat_loc);
  }
  if (win != (Fl_Window *)0x0) {
    Fl::grab(win);
  }
  Fl_Widget::label(&icon->super_Fl_Widget,a);
  Fl_Window::label(message_form,(char *)0x0);
  avoidRecursion = '\0';
  return ret_val;
}

Assistant:

static int innards(const char* fmt, va_list ap,
  const char *b0,
  const char *b1,
  const char *b2)
{
  Fl::pushed(0); // stop dragging (STR #2159)

  avoidRecursion = 1;

  makeform();
  message_form->size(410,103);
  char buffer[1024];
  if (!strcmp(fmt,"%s")) {
    message->label(va_arg(ap, const char*));
  } else {
    ::vsnprintf(buffer, 1024, fmt, ap);
    message->label(buffer);
  }

  message->labelfont(fl_message_font_);
  if (fl_message_size_ == -1)
    message->labelsize(FL_NORMAL_SIZE);
  else
    message->labelsize(fl_message_size_);
  if (b0) {button[0]->show(); button[0]->label(b0); button[1]->position(210,70);}
  else {button[0]->hide(); button[1]->position(310,70);}
  if (b1) {button[1]->show(); button[1]->label(b1);}
  else button[1]->hide();
  if (b2) {button[2]->show(); button[2]->label(b2);}
  else button[2]->hide();
  const char* prev_icon_label = icon->label();
  if (!prev_icon_label) icon->label(iconlabel);

  resizeform();

  if (button[1]->visible() && !input->visible())
    button[1]->take_focus();
  if (enableHotspot)
    message_form->hotspot(button[0]);
  if (b0 && Fl_Widget::label_shortcut(b0))
    button[0]->shortcut(0);
  else
    button[0]->shortcut(FL_Escape);

  // set default window title, if defined and a specific title is not set
  if (!message_form->label() && message_title_default)
    message_form->label(message_title_default);

  // deactivate Fl::grab(), because it is incompatible with modal windows
  Fl_Window* g = Fl::grab();
  if (g) Fl::grab(0);
  Fl_Group *current_group = Fl_Group::current(); // make sure the dialog does not interfere with any active group
  message_form->show();
  Fl_Group::current(current_group);
  while (message_form->shown()) Fl::wait();
  if (g) // regrab the previous popup menu, if there was one
    Fl::grab(g);
  icon->label(prev_icon_label);
  message_form->label(0); // reset window title

  avoidRecursion = 0;
  return ret_val;
}